

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O0

void * integrate_thread(void *arg)

{
  double *pdVar1;
  double local_48;
  double local_40;
  double h;
  double res;
  double t;
  double new_funk;
  double func;
  Argument *p;
  void *arg_local;
  
  func = (double)arg;
  p = (Argument *)arg;
  new_funk = std::function<double_(double)>::operator()
                       (*(function<double_(double)> **)((long)arg + 0x28),
                        *(double *)((long)arg + 0x10));
  res = *(double *)((long)func + 0x10);
  h = 0.0;
  while (res < *(double *)((long)func + 0x18) - *(double *)((long)func + 0x20) / 2.0) {
    local_48 = *(double *)((long)func + 0x18) - res;
    pdVar1 = std::min<double>((double *)((long)func + 0x20),&local_48);
    local_40 = *pdVar1;
    res = local_40 + res;
    t = std::function<double_(double)>::operator()
                  (*(function<double_(double)> **)((long)func + 0x28),res);
    h = ((t + new_funk) * local_40) / 2.0 + h;
    new_funk = t;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)func);
  **(double **)((long)func + 8) = h + **(double **)((long)func + 8);
  pthread_mutex_unlock(*(pthread_mutex_t **)func);
  return (void *)0x0;
}

Assistant:

void * integrate_thread(void * arg){
  auto p = reinterpret_cast<Argument *>(arg);
  double func = (*(p -> func))(p -> a), new_funk, t = p -> a;
  double res  = 0;
  while(t < p -> b - p-> h/2){
    auto h = std::min(p -> h, p -> b - t);
    t += h;
    new_funk = (*(p -> func))(t);
    res +=  (new_funk + func) * h / 2;
    func = new_funk;
  }
  pthread_mutex_lock(p->mutex);
  *(p -> result) += res;
  pthread_mutex_unlock(p->mutex);
  return nullptr;
}